

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O0

int __thiscall ncnn::Scale::load_model(Scale *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *in_stack_ffffffffffffff30;
  Mat *m;
  Mat *this_00;
  Mat local_b8;
  Mat local_60;
  long *local_18;
  int local_4;
  
  if (*(int *)(in_RDI + 0xd0) == -0xe9) {
    local_4 = 0;
  }
  else {
    this_00 = &local_60;
    local_18 = in_RSI;
    (**(code **)(*in_RSI + 0x10))(this_00,in_RSI,*(undefined4 *)(in_RDI + 0xd0),1);
    Mat::operator=(this_00,in_stack_ffffffffffffff30);
    Mat::~Mat((Mat *)0x50a66d);
    bVar1 = Mat::empty(in_stack_ffffffffffffff30);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      if (*(int *)(in_RDI + 0xd4) != 0) {
        m = &local_b8;
        (**(code **)(*local_18 + 0x10))(m,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
        Mat::operator=(this_00,m);
        Mat::~Mat((Mat *)0x50a710);
        bVar1 = Mat::empty(m);
        if (bVar1) {
          return -100;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Scale::load_model(const ModelBin& mb)
{
    if (scale_data_size == -233)
        return 0;

    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(scale_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}